

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O2

uint lodepng_convert(uchar *out,uchar *in,LodePNGColorMode *mode_out,LodePNGColorMode *mode_in,
                    uint w,uint h)

{
  LodePNGColorType LVar1;
  ulong uVar2;
  uchar uVar3;
  int iVar4;
  uint uVar5;
  size_t sVar6;
  uchar uVar7;
  uchar uVar8;
  uint uVar9;
  uchar uVar10;
  unsigned_short gray;
  uchar uVar11;
  uchar *puVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  bool bVar16;
  size_t local_f8;
  unsigned_short g;
  LodePNGColorMode *local_e0;
  LodePNGColorMode *local_d8;
  unsigned_short a;
  unsigned_short b;
  unsigned_short r;
  uchar *local_c0;
  ColorTree tree;
  
  uVar2 = (ulong)w;
  LVar1 = mode_in->colortype;
  if ((LVar1 == LCT_PALETTE) && (mode_in->palette == (uchar *)0x0)) {
    return 0x6b;
  }
  iVar4 = lodepng_color_mode_equal(mode_out,mode_in);
  if (iVar4 != 0) {
    sVar6 = lodepng_get_raw_size(w,h,mode_in);
LAB_0011981f:
    lodepng_memcpy(out,in,sVar6);
    return 0;
  }
  local_e0 = mode_out;
  local_d8 = mode_in;
  local_c0 = out;
  if (mode_out->colortype == LCT_PALETTE) {
    uVar14 = mode_out->palettesize;
    uVar15 = 1L << ((byte)mode_out->bitdepth & 0x3f);
    if (uVar14 == 0) {
      puVar12 = mode_in->palette;
      uVar14 = mode_in->palettesize;
      if ((LVar1 == LCT_PALETTE) && (mode_in->bitdepth == mode_out->bitdepth)) {
        sVar6 = lodepng_get_raw_size(w,h,mode_in);
        out = local_c0;
        goto LAB_0011981f;
      }
    }
    else {
      puVar12 = mode_out->palette;
    }
    if (uVar14 < uVar15) {
      uVar15 = uVar14;
    }
    color_tree_init(&tree);
    uVar14 = 0;
    do {
      if (uVar15 == uVar14) goto LAB_001198f9;
      uVar5 = color_tree_add(&tree,puVar12[uVar14 * 4],puVar12[uVar14 * 4 + 1],
                             puVar12[uVar14 * 4 + 2],puVar12[uVar14 * 4 + 3],(uint)uVar14);
      uVar14 = uVar14 + 1;
    } while (uVar5 == 0);
    goto switchD_00119a7b_caseD_1;
  }
LAB_001198f9:
  puVar12 = local_c0;
  uVar15 = (ulong)h;
  local_f8 = uVar15 * uVar2;
  uVar9 = local_d8->bitdepth;
  uVar14 = (ulong)uVar9;
  if (local_e0->bitdepth == 0x10 && uVar9 == 0x10) {
    lVar13 = 0;
    for (sVar6 = 0; local_f8 != sVar6; sVar6 = sVar6 + 1) {
      _r = _r & 0xffffffffffff0000;
      g = 0;
      b = 0;
      a = 0;
      getPixelColorRGBA16(&r,&g,&b,&a,in,sVar6,local_d8);
      uVar7 = (uchar)_r;
      uVar11 = (uchar)(_r >> 8);
      uVar8 = (uchar)(a >> 8);
      uVar10 = (uchar)(g >> 8);
      uVar3 = (uchar)(b >> 8);
      switch(local_e0->colortype) {
      case LCT_GREY:
        *(unsigned_short *)(local_c0 + sVar6 * 2) = r << 8 | r >> 8;
        break;
      case LCT_RGB:
        local_c0[lVar13 * 2] = uVar11;
        local_c0[lVar13 * 2 + 1] = uVar7;
        local_c0[lVar13 * 2 + 2] = uVar10;
        local_c0[lVar13 * 2 + 3] = (uchar)g;
        local_c0[lVar13 * 2 + 4] = uVar3;
        local_c0[lVar13 * 2 + 5] = (uchar)b;
        break;
      case LCT_GREY_ALPHA:
        local_c0[sVar6 * 4] = uVar11;
        local_c0[sVar6 * 4 + 1] = uVar7;
        local_c0[sVar6 * 4 + 2] = uVar8;
        local_c0[sVar6 * 4 + 3] = (uchar)a;
        break;
      case LCT_RGBA:
        local_c0[sVar6 * 8] = uVar11;
        local_c0[sVar6 * 8 + 1] = uVar7;
        local_c0[sVar6 * 8 + 2] = uVar10;
        local_c0[sVar6 * 8 + 3] = (uchar)g;
        local_c0[sVar6 * 8 + 4] = uVar3;
        local_c0[sVar6 * 8 + 5] = (uchar)b;
        local_c0[sVar6 * 8 + 6] = uVar8;
        local_c0[sVar6 * 8 + 7] = (uchar)a;
      }
      lVar13 = lVar13 + 3;
    }
  }
  else {
    if (local_e0->bitdepth == 8) {
      if (local_e0->colortype == LCT_RGB) {
        uVar5 = 0;
        switch(local_d8->colortype) {
        case LCT_GREY:
          if (uVar14 == 8) {
            puVar12 = local_c0 + 2;
            for (sVar6 = 0; uVar5 = 0, local_f8 != sVar6; sVar6 = sVar6 + 1) {
              uVar3 = in[sVar6];
              *puVar12 = uVar3;
              puVar12[-1] = uVar3;
              puVar12[-2] = uVar3;
              puVar12 = puVar12 + 3;
            }
            break;
          }
          if (uVar9 == 0x10) {
            puVar12 = local_c0 + 2;
            for (sVar6 = 0; uVar5 = 0, local_f8 != sVar6; sVar6 = sVar6 + 1) {
              uVar3 = in[sVar6 * 2];
              *puVar12 = uVar3;
              puVar12[-1] = uVar3;
              puVar12[-2] = uVar3;
              puVar12 = puVar12 + 3;
            }
            break;
          }
          _r = 0;
          puVar12 = local_c0 + 2;
          while (bVar16 = local_f8 != 0, local_f8 = local_f8 - 1, bVar16) {
            uVar5 = readBitsFromReversedStream((size_t *)&r,in,uVar14);
            uVar3 = (uchar)((uVar5 * 0xff) / (uint)~(-1 << ((byte)uVar9 & 0x1f)));
            *puVar12 = uVar3;
            puVar12[-1] = uVar3;
            puVar12[-2] = uVar3;
            puVar12 = puVar12 + 3;
          }
LAB_0011a2cf:
          uVar5 = 0;
          break;
        case LCT_RGB:
          if (uVar9 != 8) {
            lVar13 = 0;
            while (bVar16 = local_f8 != 0, local_f8 = local_f8 - 1, uVar5 = 0, bVar16) {
              local_c0[lVar13] = in[lVar13 * 2];
              local_c0[lVar13 + 1] = in[lVar13 * 2 + 2];
              local_c0[lVar13 + 2] = in[lVar13 * 2 + 4];
              lVar13 = lVar13 + 3;
            }
            break;
          }
          local_f8 = local_f8 * 3;
LAB_00119e64:
          lodepng_memcpy(local_c0,in,local_f8);
          uVar5 = 0;
          break;
        case LCT_PALETTE:
          if (uVar9 == 8) {
            for (sVar6 = 0; uVar5 = 0, local_f8 != sVar6; sVar6 = sVar6 + 1) {
              lodepng_memcpy(puVar12,local_d8->palette + (ulong)in[sVar6] * 4,3);
              puVar12 = puVar12 + 3;
            }
          }
          else {
            _r = 0;
            while (bVar16 = local_f8 != 0, local_f8 = local_f8 - 1, uVar5 = 0, bVar16) {
              uVar5 = readBitsFromReversedStream((size_t *)&r,in,uVar14);
              lodepng_memcpy(puVar12,local_d8->palette + uVar5 * 4,3);
              puVar12 = puVar12 + 3;
            }
          }
          break;
        case LCT_GREY_ALPHA:
          puVar12 = local_c0 + 2;
          sVar6 = 0;
          uVar5 = 0;
          if (uVar9 == 8) {
            for (; local_f8 != sVar6; sVar6 = sVar6 + 1) {
              uVar3 = in[sVar6 * 2];
              *puVar12 = uVar3;
              puVar12[-1] = uVar3;
              puVar12[-2] = uVar3;
              puVar12 = puVar12 + 3;
            }
          }
          else {
            for (; local_f8 != sVar6; sVar6 = sVar6 + 1) {
              uVar3 = in[sVar6 * 4];
              *puVar12 = uVar3;
              puVar12[-1] = uVar3;
              puVar12[-2] = uVar3;
              puVar12 = puVar12 + 3;
            }
          }
          break;
        case LCT_RGBA:
          if (uVar9 == 8) {
            while (bVar16 = local_f8 != 0, local_f8 = local_f8 - 1, uVar5 = 0, bVar16) {
              lodepng_memcpy(puVar12,in,3);
              in = in + 4;
              puVar12 = puVar12 + 3;
            }
          }
          else {
            for (sVar6 = 0; uVar5 = 0, local_f8 != sVar6; sVar6 = sVar6 + 1) {
              *puVar12 = in[sVar6 * 8];
              puVar12[1] = in[sVar6 * 8 + 2];
              puVar12[2] = in[sVar6 * 8 + 4];
              puVar12 = puVar12 + 3;
            }
          }
        }
        goto switchD_00119a7b_caseD_1;
      }
      if (local_e0->colortype == LCT_RGBA) {
        uVar5 = 0;
        switch(local_d8->colortype) {
        case LCT_GREY:
          if (uVar14 == 0x10) {
            for (sVar6 = 0; uVar5 = 0, local_f8 != sVar6; sVar6 = sVar6 + 1) {
              uVar3 = in[sVar6 * 2];
              local_c0[sVar6 * 4 + 2] = uVar3;
              local_c0[sVar6 * 4 + 1] = uVar3;
              local_c0[sVar6 * 4] = uVar3;
              if (local_d8->key_defined == 0) {
                uVar3 = 0xff;
              }
              else {
                uVar3 = -((uint)CONCAT11(uVar3,in[sVar6 * 2 + 1]) != local_d8->key_r);
              }
              local_c0[sVar6 * 4 + 3] = uVar3;
            }
            break;
          }
          if (uVar9 == 8) {
            for (sVar6 = 0; sVar6 != local_f8; sVar6 = sVar6 + 1) {
              uVar3 = in[sVar6];
              puVar12[2] = uVar3;
              puVar12[1] = uVar3;
              *puVar12 = uVar3;
              puVar12[3] = 0xff;
              puVar12 = puVar12 + 4;
            }
            uVar5 = 0;
            if (local_d8->key_defined != 0) {
              for (lVar13 = -(uVar15 * uVar2); lVar13 != 0; lVar13 = lVar13 + 1) {
                if (local_d8->key_r == (uint)puVar12[lVar13 * 4]) {
                  puVar12[lVar13 * 4 + 3] = '\0';
                }
              }
            }
            break;
          }
          _r = 0;
          for (sVar6 = 0; local_f8 != sVar6; sVar6 = sVar6 + 1) {
            uVar5 = readBitsFromReversedStream((size_t *)&r,in,uVar14);
            uVar3 = (uchar)((uVar5 * 0xff) / (uint)~(-1 << ((byte)uVar9 & 0x1f)));
            local_c0[sVar6 * 4 + 2] = uVar3;
            local_c0[sVar6 * 4 + 1] = uVar3;
            local_c0[sVar6 * 4] = uVar3;
            if (local_d8->key_defined == 0) {
              uVar3 = 0xff;
            }
            else {
              uVar3 = -(uVar5 != local_d8->key_r);
            }
            local_c0[sVar6 * 4 + 3] = uVar3;
          }
          goto LAB_0011a2cf;
        case LCT_RGB:
          if (uVar9 == 8) {
            for (sVar6 = 0; sVar6 != local_f8; sVar6 = sVar6 + 1) {
              lodepng_memcpy(puVar12,in + sVar6 * 3,3);
              puVar12[3] = 0xff;
              puVar12 = puVar12 + 4;
            }
            uVar5 = 0;
            if (local_d8->key_defined != 0) {
              for (lVar13 = -(uVar15 * uVar2); uVar5 = 0, lVar13 != 0; lVar13 = lVar13 + 1) {
                if (((local_d8->key_r == (uint)puVar12[lVar13 * 4]) &&
                    (local_d8->key_g == (uint)puVar12[lVar13 * 4 + 1])) &&
                   (local_d8->key_b == (uint)puVar12[lVar13 * 4 + 2])) {
                  puVar12[lVar13 * 4 + 3] = '\0';
                }
              }
            }
          }
          else {
            puVar12 = in + 5;
            for (sVar6 = 0; uVar5 = 0, local_f8 != sVar6; sVar6 = sVar6 + 1) {
              uVar3 = puVar12[-5];
              local_c0[sVar6 * 4] = uVar3;
              uVar8 = puVar12[-3];
              local_c0[sVar6 * 4 + 1] = uVar8;
              uVar10 = puVar12[-1];
              local_c0[sVar6 * 4 + 2] = uVar10;
              uVar7 = 0xff;
              if (((local_d8->key_defined != 0) &&
                  ((uint)CONCAT11(uVar3,puVar12[-4]) == local_d8->key_r)) &&
                 ((uint)CONCAT11(uVar8,puVar12[-2]) == local_d8->key_g)) {
                uVar7 = -((uint)CONCAT11(uVar10,*puVar12) != local_d8->key_b);
              }
              local_c0[sVar6 * 4 + 3] = uVar7;
              puVar12 = puVar12 + 6;
            }
          }
          break;
        case LCT_PALETTE:
          if (uVar9 == 8) {
            for (sVar6 = 0; uVar5 = 0, local_f8 != sVar6; sVar6 = sVar6 + 1) {
              lodepng_memcpy(puVar12,local_d8->palette + (ulong)in[sVar6] * 4,4);
              puVar12 = puVar12 + 4;
            }
          }
          else {
            _r = 0;
            while (bVar16 = local_f8 != 0, local_f8 = local_f8 - 1, uVar5 = 0, bVar16) {
              uVar5 = readBitsFromReversedStream((size_t *)&r,in,uVar14);
              lodepng_memcpy(puVar12,local_d8->palette + uVar5 * 4,4);
              puVar12 = puVar12 + 4;
            }
          }
          break;
        case LCT_GREY_ALPHA:
          sVar6 = 0;
          uVar5 = 0;
          if (uVar9 == 8) {
            for (; local_f8 != sVar6; sVar6 = sVar6 + 1) {
              uVar3 = in[sVar6 * 2];
              local_c0[sVar6 * 4 + 2] = uVar3;
              local_c0[sVar6 * 4 + 1] = uVar3;
              local_c0[sVar6 * 4] = uVar3;
              local_c0[sVar6 * 4 + 3] = in[sVar6 * 2 + 1];
            }
          }
          else {
            for (; local_f8 != sVar6; sVar6 = sVar6 + 1) {
              uVar3 = in[sVar6 * 4];
              local_c0[sVar6 * 4 + 2] = uVar3;
              local_c0[sVar6 * 4 + 1] = uVar3;
              local_c0[sVar6 * 4] = uVar3;
              local_c0[sVar6 * 4 + 3] = in[sVar6 * 4 + 2];
            }
          }
          break;
        case LCT_RGBA:
          if (uVar9 != 8) {
            for (sVar6 = 0; uVar5 = 0, local_f8 != sVar6; sVar6 = sVar6 + 1) {
              local_c0[sVar6 * 4] = in[sVar6 * 8];
              local_c0[sVar6 * 4 + 1] = in[sVar6 * 8 + 2];
              local_c0[sVar6 * 4 + 2] = in[sVar6 * 8 + 4];
              local_c0[sVar6 * 4 + 3] = in[sVar6 * 8 + 6];
            }
            break;
          }
          local_f8 = local_f8 * 4;
          goto LAB_00119e64;
        }
        goto switchD_00119a7b_caseD_1;
      }
    }
    _r = _r & 0xffffffffffffff00;
    g = g & 0xff00;
    b = b & 0xff00;
    a = a & 0xff00;
    lVar13 = 0;
    for (sVar6 = 0; local_f8 != sVar6; sVar6 = sVar6 + 1) {
      getPixelColorRGBA8((uchar *)&r,(uchar *)&g,(uchar *)&b,(uchar *)&a,in,sVar6,local_d8);
      switch(local_e0->colortype) {
      case LCT_GREY:
        uVar9 = local_e0->bitdepth;
        if (uVar9 == 0x10) {
          puVar12[sVar6 * 2 + 1] = (byte)r;
          puVar12[sVar6 * 2] = (byte)r;
        }
        else if (uVar9 == 8) {
          puVar12[sVar6] = (byte)r;
        }
        else {
          uVar5 = ~(-1 << ((byte)uVar9 & 0x1f)) & (uint)((byte)r >> (8 - (byte)uVar9 & 0x1f));
LAB_00119cac:
          addColorBits(puVar12,sVar6,uVar9,uVar5);
        }
        break;
      case LCT_RGB:
        if (local_e0->bitdepth == 8) {
          puVar12[lVar13] = (byte)r;
          puVar12[lVar13 + 1] = (uchar)g;
          puVar12[lVar13 + 2] = (uchar)b;
        }
        else {
          puVar12[lVar13 * 2 + 1] = (byte)r;
          puVar12[lVar13 * 2] = (byte)r;
          puVar12[lVar13 * 2 + 3] = (uchar)g;
          puVar12[lVar13 * 2 + 2] = (uchar)g;
          puVar12[lVar13 * 2 + 5] = (uchar)b;
          puVar12[lVar13 * 2 + 4] = (uchar)b;
        }
        break;
      case LCT_PALETTE:
        uVar5 = color_tree_get(&tree,(byte)r,(uchar)g,(uchar)b,(uchar)a);
        if ((int)uVar5 < 0) {
          uVar5 = 0x52;
          goto switchD_00119a7b_caseD_1;
        }
        uVar9 = local_e0->bitdepth;
        if (uVar9 != 8) goto LAB_00119cac;
        puVar12[sVar6] = (uchar)uVar5;
        break;
      case LCT_GREY_ALPHA:
        if (local_e0->bitdepth == 0x10) {
          puVar12[sVar6 * 4 + 1] = (byte)r;
          puVar12[sVar6 * 4] = (byte)r;
          puVar12[sVar6 * 4 + 3] = (uchar)a;
          puVar12[sVar6 * 4 + 2] = (uchar)a;
        }
        else if (local_e0->bitdepth == 8) {
          puVar12[sVar6 * 2] = (byte)r;
          puVar12[sVar6 * 2 + 1] = (uchar)a;
        }
        break;
      case LCT_RGBA:
        if (local_e0->bitdepth == 8) {
          puVar12[sVar6 * 4] = (byte)r;
          puVar12[sVar6 * 4 + 1] = (uchar)g;
          puVar12[sVar6 * 4 + 2] = (uchar)b;
          puVar12[sVar6 * 4 + 3] = (uchar)a;
        }
        else {
          puVar12[sVar6 * 8 + 1] = (byte)r;
          puVar12[sVar6 * 8] = (byte)r;
          puVar12[sVar6 * 8 + 3] = (uchar)g;
          puVar12[sVar6 * 8 + 2] = (uchar)g;
          puVar12[sVar6 * 8 + 5] = (uchar)b;
          puVar12[sVar6 * 8 + 4] = (uchar)b;
          puVar12[sVar6 * 8 + 7] = (uchar)a;
          puVar12[sVar6 * 8 + 6] = (uchar)a;
        }
      }
      lVar13 = lVar13 + 3;
    }
  }
  uVar5 = 0;
switchD_00119a7b_caseD_1:
  if (local_e0->colortype == LCT_PALETTE) {
    color_tree_cleanup(&tree);
  }
  return uVar5;
}

Assistant:

unsigned lodepng_convert(unsigned char* out, const unsigned char* in,
                         const LodePNGColorMode* mode_out, const LodePNGColorMode* mode_in,
                         unsigned w, unsigned h) {
  size_t i;
  ColorTree tree;
  size_t numpixels = (size_t)w * (size_t)h;
  unsigned error = 0;

  if(mode_in->colortype == LCT_PALETTE && !mode_in->palette) {
    return 107; /* error: must provide palette if input mode is palette */
  }

  if(lodepng_color_mode_equal(mode_out, mode_in)) {
    size_t numbytes = lodepng_get_raw_size(w, h, mode_in);
    lodepng_memcpy(out, in, numbytes);
    return 0;
  }

  if(mode_out->colortype == LCT_PALETTE) {
    size_t palettesize = mode_out->palettesize;
    const unsigned char* palette = mode_out->palette;
    size_t palsize = (size_t)1u << mode_out->bitdepth;
    /*if the user specified output palette but did not give the values, assume
    they want the values of the input color type (assuming that one is palette).
    Note that we never create a new palette ourselves.*/
    if(palettesize == 0) {
      palettesize = mode_in->palettesize;
      palette = mode_in->palette;
      /*if the input was also palette with same bitdepth, then the color types are also
      equal, so copy literally. This to preserve the exact indices that were in the PNG
      even in case there are duplicate colors in the palette.*/
      if(mode_in->colortype == LCT_PALETTE && mode_in->bitdepth == mode_out->bitdepth) {
        size_t numbytes = lodepng_get_raw_size(w, h, mode_in);
        lodepng_memcpy(out, in, numbytes);
        return 0;
      }
    }
    if(palettesize < palsize) palsize = palettesize;
    color_tree_init(&tree);
    for(i = 0; i != palsize; ++i) {
      const unsigned char* p = &palette[i * 4];
      error = color_tree_add(&tree, p[0], p[1], p[2], p[3], (unsigned)i);
      if(error) break;
    }
  }

  if(!error) {
    if(mode_in->bitdepth == 16 && mode_out->bitdepth == 16) {
      for(i = 0; i != numpixels; ++i) {
        unsigned short r = 0, g = 0, b = 0, a = 0;
        getPixelColorRGBA16(&r, &g, &b, &a, in, i, mode_in);
        rgba16ToPixel(out, i, mode_out, r, g, b, a);
      }
    } else if(mode_out->bitdepth == 8 && mode_out->colortype == LCT_RGBA) {
      getPixelColorsRGBA8(out, numpixels, in, mode_in);
    } else if(mode_out->bitdepth == 8 && mode_out->colortype == LCT_RGB) {
      getPixelColorsRGB8(out, numpixels, in, mode_in);
    } else {
      unsigned char r = 0, g = 0, b = 0, a = 0;
      for(i = 0; i != numpixels; ++i) {
        getPixelColorRGBA8(&r, &g, &b, &a, in, i, mode_in);
        error = rgba8ToPixel(out, i, mode_out, &tree, r, g, b, a);
        if(error) break;
      }
    }
  }

  if(mode_out->colortype == LCT_PALETTE) {
    color_tree_cleanup(&tree);
  }

  return error;
}